

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

Var Js::RecyclableObjectWalker::GetObject
              (RecyclableObject *originalInstance,RecyclableObject *instance,PropertyId propertyId,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *local_38;
  Var obj;
  
  if (instance == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xad2,"(instance)","instance");
    if (!bVar2) goto LAB_007e813b;
    *puVar4 = 0;
  }
  if ((uint)propertyId < 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xad3,"(!Js::IsInternalPropertyId(propertyId))",
                                "!Js::IsInternalPropertyId(propertyId)");
    if (!bVar2) {
LAB_007e813b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_38 = (RecyclableObject *)0x0;
  BVar3 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                    (originalInstance,instance,propertyId,&local_38,scriptContext);
  if (BVar3 == 0) {
    local_38 = ScriptContext::GetMissingPropertyResult
                         ((((((instance->type).ptr)->javascriptLibrary).ptr)->
                          super_JavascriptLibraryBase).scriptContext.ptr);
  }
  return local_38;
}

Assistant:

Var RecyclableObjectWalker::GetObject(RecyclableObject* originalInstance, RecyclableObject* instance, PropertyId propertyId, ScriptContext* scriptContext)
    {
        Assert(instance);
        Assert(!Js::IsInternalPropertyId(propertyId));

        Var obj = nullptr;
        try
        {
            if (!RecyclableObjectDisplay::GetPropertyWithScriptEnter(originalInstance, instance, propertyId, &obj, scriptContext))
            {
                return instance->GetScriptContext()->GetMissingPropertyResult();
            }
        }
        catch(const JavascriptException& err)
        {
            Var error = err.GetAndClear()->GetThrownObject(instance->GetScriptContext());
            if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
            {
                obj = error;
            }
        }

        return obj;
    }